

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTest.h
# Opt level: O0

void AssertNoMatch(CMReturn In)

{
  allocator<char> local_c9;
  string local_c8;
  string local_a8;
  allocator<char> local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  _CM_RETURN_STATUS local_c;
  
  local_c = NO_MATCH;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"AssertNoMatch",&local_71);
  std::operator+(&local_50,&local_70,": ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"NO_MATCH == In.Status",&local_c9);
  cute::cute_to_string::backslashQuoteTabNewline(&local_a8,&local_c8);
  std::operator+(&local_30,&local_50,&local_a8);
  cute::assert_equal<_CM_RETURN_STATUS,_CM_RETURN_STATUS>
            (&local_c,(_CM_RETURN_STATUS *)&In.Size,&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/UnitTests/UnitTest.h"
             ,0x21);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  return;
}

Assistant:

void AssertNoMatch(CMReturn In)
{
	ASSERT_EQUAL(NO_MATCH, In.Status);
}